

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall CClient::OnClientOnline(CClient *this)

{
  long lVar1;
  CConfig *pCVar2;
  long in_FS_OFFSET;
  byte local_22b1;
  byte local_22a2;
  bool ShouldStorePassword;
  CClient *this_local;
  undefined1 auStack_2298 [4];
  CServerInfo Info;
  
  Info.m_aClients[0x21].m_aName[4] = '\0';
  Info.m_aClients[0x21].m_aName[5] = '\0';
  Info.m_aClients[0x21].m_aName[6] = '\0';
  Info.m_aClients[0x21].m_aName[7] = '\0';
  Info.m_aClients[0x21].m_aName[8] = '\0';
  Info.m_aClients[0x21].m_aName[9] = '\0';
  Info.m_aClients[0x21].m_aName[10] = '\0';
  Info.m_aClients[0x21].m_aName[0xb] = '\0';
  Info.m_aClients[2].m_aName[0] = '\0';
  Info.m_aClients[2].m_aName[1] = '\0';
  Info.m_aClients[2].m_aName[2] = '\0';
  Info.m_aClients[2].m_aName[3] = '\0';
  Info.m_aClients[2].m_aName[4] = '\0';
  Info.m_aClients[2].m_aName[5] = '\0';
  Info.m_aClients[2].m_aName[6] = '\0';
  Info.m_aClients[2].m_aName[7] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (*(this->super_IClient).super_IInterface._vptr_IInterface[7])();
  memset(&Info,0,0x228c);
  (*(this->super_IClient).super_IInterface._vptr_IInterface[0x1d])(this,&Info);
  pCVar2 = Config(this);
  local_22a2 = 1;
  if (pCVar2->m_ClSaveServerPasswords != 2) {
    pCVar2 = Config(this);
    local_22b1 = 0;
    if (pCVar2->m_ClSaveServerPasswords == 1) {
      local_22b1 = Info.m_Favorite;
    }
    local_22a2 = local_22b1;
  }
  if (((this->m_aServerPassword[0] != '\0') && ((local_22a2 & 1) != 0)) &&
     ((Info.m_Flags & 1U) != 0)) {
    CServerBrowser::SetFavoritePassword
              ((CServerBrowser *)Info.m_NetAddr._0_8_,_auStack_2298,(char *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CClient::OnClientOnline()
{
	DemoRecorder_HandleAutoStart();

	// store password and server as favorite if configured, if the server was password protected
	CServerInfo Info = {0};
	GetServerInfo(&Info);
	bool ShouldStorePassword = Config()->m_ClSaveServerPasswords == 2 || (Config()->m_ClSaveServerPasswords == 1 && Info.m_Favorite);
	if(m_aServerPassword[0] && ShouldStorePassword && (Info.m_Flags&IServerBrowser::FLAG_PASSWORD))
	{
		m_ServerBrowser.SetFavoritePassword(m_aServerAddressStr, m_aServerPassword);
	}
}